

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

bool ImGui::ShowStyleSelector(char *label)

{
  bool bVar1;
  
  bVar1 = Combo(label,&ShowStyleSelector::style_idx,"Dark",-1);
  if (bVar1) {
    if (ShowStyleSelector::style_idx == 2) {
      StyleColorsClassic((ImGuiStyle *)0x0);
    }
    else if (ShowStyleSelector::style_idx == 1) {
      StyleColorsLight((ImGuiStyle *)0x0);
    }
    else if (ShowStyleSelector::style_idx == 0) {
      StyleColorsDark((ImGuiStyle *)0x0);
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::ShowStyleSelector(const char* label)
{
    static int style_idx = -1;
    if (ImGui::Combo(label, &style_idx, "Dark\0Light\0Classic\0"))
    {
        switch (style_idx)
        {
        case 0: ImGui::StyleColorsDark(); break;
        case 1: ImGui::StyleColorsLight(); break;
        case 2: ImGui::StyleColorsClassic(); break;
        }
        return true;
    }
    return false;
}